

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

SequenceDeclarationSyntax * __thiscall
slang::parsing::Parser::parseSequenceDeclaration(Parser *this,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL> elements_00;
  Token name_00;
  Token nameToken;
  Token keyword_00;
  Token semi_00;
  Token optionalSemi;
  Token end_00;
  undefined1 uVar1;
  int iVar2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_00;
  ParserBase *this_00;
  Info *pIVar3;
  NamedBlockClauseSyntax *pNVar4;
  undefined4 extraout_var;
  SequenceDeclarationSyntax *pSVar5;
  Info *pIVar6;
  EVP_PKEY_CTX *src;
  undefined8 *in_RDI;
  Token TVar7;
  Token TVar8;
  NamedBlockClauseSyntax *blockName;
  Token end;
  Token semi2;
  SequenceExprSyntax *expr;
  SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL> declarations;
  Token semi;
  AssertionItemPortListSyntax *portList;
  Token name;
  Token keyword;
  LocalVariableDeclarationSyntax **in_stack_fffffffffffffd68;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffd70;
  pointer in_stack_fffffffffffffd78;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd80;
  ParserBase *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  Parser *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  Info *in_stack_fffffffffffffdb0;
  Parser *in_stack_fffffffffffffdc8;
  Parser *in_stack_fffffffffffffdd8;
  undefined8 *puVar9;
  NamedBlockClauseSyntax *pNVar10;
  undefined6 uVar11;
  TokenKind in_stack_fffffffffffffdfe;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffe00;
  ParserBase *pPVar12;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar13;
  LocalVariableDeclarationSyntax *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  Parser *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffed0;
  SyntaxKind parentKind;
  Parser *in_stack_fffffffffffffed8;
  SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> local_90 [2];
  Token local_50;
  AssertionItemPortListSyntax *local_40;
  Token local_38;
  Token local_28;
  AssertionItemPortListSyntax *portList_00;
  
  parentKind = (SyntaxKind)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  local_28 = ParserBase::consume(in_stack_fffffffffffffd90);
  local_38 = ParserBase::expect(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfe);
  local_40 = parseAssertionItemPortList(in_stack_fffffffffffffed8,parentKind);
  local_50 = ParserBase::expect(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfe);
  SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL> *)0xa3b18f);
  while( true ) {
    uVar1 = isLocalVariableDeclaration(in_stack_fffffffffffffdd8);
    if (!(bool)uVar1) break;
    in_stack_fffffffffffffe10 = parseLocalVariableDeclaration(in_stack_fffffffffffffe80);
    SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  }
  attributes_00 =
       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
       parseSequenceExpr(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                         SUB41((uint)in_stack_fffffffffffffd98 >> 0x18,0));
  pSVar13 = attributes_00;
  TVar7 = ParserBase::expect(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfe);
  this_00 = TVar7._0_8_;
  uVar11 = TVar7.info._0_6_;
  kind = TVar7.info._6_2_;
  pPVar12 = this_00;
  TVar8 = ParserBase::expect(this_00,kind);
  pIVar6 = TVar8.info;
  pIVar3 = TVar8._0_8_;
  pNVar4 = parseNamedBlockClause(in_stack_fffffffffffffdc8);
  nameToken.info = in_stack_fffffffffffffdb0;
  nameToken.kind = (short)in_stack_fffffffffffffda8;
  nameToken._2_1_ = (char)((ulong)in_stack_fffffffffffffda8 >> 0x10);
  nameToken.numFlags.raw = (char)((ulong)in_stack_fffffffffffffda8 >> 0x18);
  nameToken.rawLen = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  pNVar10 = pNVar4;
  checkBlockNames(in_stack_fffffffffffffda0,nameToken,
                  (NamedBlockClauseSyntax *)
                  CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  puVar9 = in_RDI + 0x1c;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffd80._M_extent_value;
  elements._M_ptr = (pointer)in_stack_fffffffffffffd78;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (in_stack_fffffffffffffd70,elements);
  iVar2 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::copy
                    (local_90,(EVP_PKEY_CTX *)*in_RDI,src);
  portList_00 = (AssertionItemPortListSyntax *)CONCAT44(extraout_var,iVar2);
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffffd80._M_extent_value;
  elements_00._M_ptr = in_stack_fffffffffffffd78;
  slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *)in_stack_fffffffffffffd70,
             elements_00);
  keyword_00.info = (Info *)pNVar4;
  keyword_00._0_8_ = pIVar6;
  name_00.info = pIVar3;
  name_00._0_8_ = TVar7.info;
  semi_00.info = (Info *)pNVar10;
  semi_00._0_8_ = puVar9;
  optionalSemi.rawLen._2_2_ = kind;
  optionalSemi._0_6_ = uVar11;
  optionalSemi.info = (Info *)pPVar12;
  end_00.info = (Info *)in_stack_fffffffffffffe10;
  end_00._0_8_ = pSVar13;
  pSVar5 = slang::syntax::SyntaxFactory::sequenceDeclaration
                     ((SyntaxFactory *)this_00,attributes_00,keyword_00,name_00,portList_00,semi_00,
                      (SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *)TVar8.info,
                      TVar8._0_8_,optionalSemi,end_00,
                      (NamedBlockClauseSyntax *)CONCAT17(uVar1,in_stack_fffffffffffffe18));
  SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL> *)0xa3b4b8);
  return pSVar5;
}

Assistant:

SequenceDeclarationSyntax& Parser::parseSequenceDeclaration(AttrList attributes) {
    auto keyword = consume();
    auto name = expect(TokenKind::Identifier);
    auto portList = parseAssertionItemPortList(SyntaxKind::SequenceDeclaration);
    auto semi = expect(TokenKind::Semicolon);

    SmallVector<LocalVariableDeclarationSyntax*> declarations;
    while (isLocalVariableDeclaration())
        declarations.push_back(&parseLocalVariableDeclaration());

    auto& expr = parseSequenceExpr(0, /* isInProperty */ false);
    auto semi2 = expect(TokenKind::Semicolon);
    auto end = expect(TokenKind::EndSequenceKeyword);

    auto blockName = parseNamedBlockClause();
    checkBlockNames(name, blockName);

    return factory.sequenceDeclaration(attributes, keyword, name, portList, semi,
                                       declarations.copy(alloc), expr, semi2, end, blockName);
}